

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O2

QWidget * QApplication::activeModalWidget(void)

{
  Data *pDVar1;
  QObject *object;
  QWidgetWindow *pQVar2;
  QWidget *pQVar3;
  
  object = (QObject *)QGuiApplication::modalWindow();
  pQVar2 = QtPrivate::qobject_cast_helper<QWidgetWindow*,QObject>(object);
  if (((pQVar2 == (QWidgetWindow *)0x0) || (pDVar1 = (pQVar2->m_widget).wp.d, pDVar1 == (Data *)0x0)
      ) || (*(int *)(pDVar1 + 4) == 0)) {
    pQVar3 = (QWidget *)0x0;
  }
  else {
    pQVar3 = (QWidget *)(pQVar2->m_widget).wp.value;
  }
  return pQVar3;
}

Assistant:

QWidget *QApplication::activeModalWidget()
{
    QWidgetWindow *widgetWindow = qobject_cast<QWidgetWindow *>(modalWindow());
    return widgetWindow ? widgetWindow->widget() : nullptr;
}